

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  char cVar2;
  int iVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiGroupData *pIVar6;
  ImVec2 IVar7;
  bool bVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  char cVar11;
  ImGuiID IVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  ImRect local_38;
  ImVec2 local_28;
  
  pIVar9 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  iVar3 = (GImGui->GroupStack).Size;
  pIVar6 = (GImGui->GroupStack).Data;
  if ((pIVar5->DC).IsSetPos == true) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  IVar7 = ImMax(&(pIVar5->DC).CursorMaxPos,&(pIVar9->LastItemData).Rect.Max);
  local_38.Min = pIVar6[(long)iVar3 + -1].BackupCursorPos;
  fVar16 = pIVar6[(long)iVar3 + -1].BackupCursorPos.x;
  fVar17 = pIVar6[(long)iVar3 + -1].BackupCursorPos.y;
  uVar14 = -(uint)(fVar16 <= IVar7.x);
  uVar15 = -(uint)(fVar17 <= IVar7.y);
  local_38.Max.x = (float)(~uVar14 & (uint)fVar16 | (uint)IVar7.x & uVar14);
  local_38.Max.y = (float)(~uVar15 & (uint)fVar17 | (uint)IVar7.y & uVar15);
  (pIVar5->DC).CursorPos = local_38.Min;
  (pIVar5->DC).CursorPosPrevLine = pIVar6[(long)iVar3 + -1].BackupCursorPosPrevLine;
  fVar16 = pIVar6[(long)iVar3 + -1].BackupCursorMaxPos.x;
  fVar17 = pIVar6[(long)iVar3 + -1].BackupCursorMaxPos.y;
  uVar14 = -(uint)(local_38.Max.x <= fVar16);
  uVar15 = -(uint)(local_38.Max.y <= fVar17);
  (pIVar5->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar15 & (uint)local_38.Max.y,~uVar14 & (uint)local_38.Max.x) |
               CONCAT44((uint)fVar17 & uVar15,(uint)fVar16 & uVar14));
  (pIVar5->DC).Indent.x = pIVar6[(long)iVar3 + -1].BackupIndent.x;
  (pIVar5->DC).GroupOffset.x = pIVar6[(long)iVar3 + -1].BackupGroupOffset.x;
  (pIVar5->DC).CurrLineSize = pIVar6[(long)iVar3 + -1].BackupCurrLineSize;
  fVar16 = pIVar6[(long)iVar3 + -1].BackupCurrLineTextBaseOffset;
  (pIVar5->DC).CurrLineTextBaseOffset = fVar16;
  (pIVar5->DC).IsSameLine = pIVar6[(long)iVar3 + -1].BackupIsSameLine;
  if (pIVar9->LogEnabled == true) {
    pIVar9->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar6[(long)iVar3 + -1].EmitItem == false) {
    (pIVar9->GroupStack).Size = (pIVar9->GroupStack).Size + -1;
    return;
  }
  fVar17 = (pIVar5->DC).PrevLineTextBaseOffset;
  uVar14 = -(uint)(fVar16 <= fVar17);
  (pIVar5->DC).CurrLineTextBaseOffset = (float)(~uVar14 & (uint)fVar16 | (uint)fVar17 & uVar14);
  local_28.x = local_38.Max.x - local_38.Min.x;
  local_28.y = local_38.Max.y - local_38.Min.y;
  ItemSize(&local_28,-1.0);
  ItemAdd(&local_38,0,(ImRect *)0x0,1);
  IVar4 = pIVar9->ActiveId;
  if (pIVar6[(long)iVar3 + -1].BackupActiveIdIsAlive == IVar4) {
    if (pIVar6[(long)iVar3 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar2 = pIVar9->ActiveIdPreviousFrameIsAlive;
joined_r0x00165dbd:
      if (cVar2 != '\0') {
        IVar12 = pIVar9->ActiveIdPreviousFrame;
        cVar2 = '\x01';
        bVar10 = false;
        goto LAB_00165db0;
      }
    }
    bVar8 = false;
    cVar11 = '\0';
  }
  else {
    bVar13 = pIVar9->ActiveIdIsAlive != IVar4;
    IVar12 = IVar4;
    if (pIVar6[(long)iVar3 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar2 = pIVar9->ActiveIdPreviousFrameIsAlive;
      bVar10 = true;
      if (IVar4 == 0 || bVar13) goto joined_r0x00165dbd;
    }
    else {
      cVar11 = '\0';
      bVar8 = false;
      cVar2 = '\0';
      bVar10 = true;
      if (IVar4 == 0 || bVar13) goto LAB_00165dc3;
    }
LAB_00165db0:
    bVar8 = bVar10;
    cVar11 = cVar2;
    (pIVar9->LastItemData).ID = IVar12;
  }
LAB_00165dc3:
  IVar7.y = local_38.Max.y;
  IVar7.x = local_38.Max.x;
  (pIVar9->LastItemData).Rect.Min = local_38.Min;
  (pIVar9->LastItemData).Rect.Max = IVar7;
  if ((pIVar6[(long)iVar3 + -1].BackupHoveredIdIsAlive == false) && (pIVar9->HoveredId != 0)) {
    pIVar1 = &(pIVar9->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar8) && (pIVar9->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar9->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar14 = (pIVar9->LastItemData).StatusFlags;
  (pIVar9->LastItemData).StatusFlags = uVar14 | 0x20;
  if ((cVar11 != '\0') && (IVar4 != pIVar9->ActiveIdPreviousFrame)) {
    (pIVar9->LastItemData).StatusFlags = uVar14 | 0x60;
  }
  (pIVar9->GroupStack).Size = (pIVar9->GroupStack).Size + -1;
  if (pIVar9->DebugShowGroupRects == true) {
    ImDrawList::AddRect(pIVar5->DrawList,&local_38.Min,&local_38.Max,0xffff00ff,0.0,0,1.0);
  }
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Include LastItemData.Rect.Max as a workaround for e.g. EndTable() undershooting with CursorMaxPos report. (#7543)
    ImRect group_bb(group_data.BackupCursorPos, ImMax(ImMax(window->DC.CursorMaxPos, g.LastItemData.Rect.Max), group_data.BackupCursorPos));
    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorPosPrevLine = group_data.BackupCursorPosPrevLine;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, group_bb.Max);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    window->DC.IsSameLine = group_data.BackupIsSameLine;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset); // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    if (g.DebugShowGroupRects)
        window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}